

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool ucnv_isFixedWidth_63(UConverter *cnv,UErrorCode *status)

{
  UConverterType UVar1;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (cnv == (UConverter *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UVar1 = (UConverterType)cnv->sharedData->staticData->conversionType;
      if (UVar1 == UCNV_MBCS) {
        UVar1 = ucnv_MBCSGetType_63(cnv);
      }
      if (((uint)UVar1 < 0x1f) && ((0x44000183U >> (UVar1 & UCNV_CESU8) & 1) != 0)) {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }